

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.c
# Opt level: O2

void cmsysMD5_Finalize(cmsysMD5 *md5,uchar *digest)

{
  byte bVar1;
  long lVar2;
  md5_byte_t data [8];
  
  bVar1 = 0;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    data[lVar2] = (md5_byte_t)
                  (*(uint *)((long)(md5->md5_state).count + (ulong)((uint)lVar2 & 0xfffffffc)) >>
                  (bVar1 & 0x18));
    bVar1 = bVar1 + 8;
  }
  md5_append(&md5->md5_state,md5_finish_pad,
             (ulong)((0x37 - ((md5->md5_state).count[0] >> 3) & 0x3f) + 1));
  md5_append(&md5->md5_state,data,8);
  bVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    digest[lVar2] =
         (uchar)(*(uint *)((long)(md5->md5_state).abcd + (ulong)((uint)lVar2 & 0xfffffffc)) >>
                (bVar1 & 0x18));
    bVar1 = bVar1 + 8;
  }
  return;
}

Assistant:

void kwsysMD5_Finalize(kwsysMD5* md5, unsigned char digest[16])
{
  md5_finish(&md5->md5_state, (md5_byte_t*)digest);
}